

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl10.c
# Opt level: O2

size_t th10_instr_size(uint version,thecl_instr_t *instr,_Bool is_timeline)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  undefined3 in_register_00000011;
  size_t sVar5;
  list_node_t *plVar6;
  
  if (CONCAT31(in_register_00000011,is_timeline) == 0) {
    plVar6 = (list_node_t *)&instr->params;
    sVar5 = 0x10;
    while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
      piVar2 = (int *)plVar6->data;
      iVar1 = *piVar2;
      if (iVar1 == 0x78) {
LAB_00119399:
        if (g_ecl_encode_cp932 == true) {
          uVar3 = utf8_to_cp932_len(*(char **)(piVar2 + 4));
        }
        else {
          uVar3 = strlen(*(char **)(piVar2 + 4));
        }
        lVar4 = (uVar3 & 0xfffffffffffffffc) + 8;
      }
      else {
        lVar4 = 4;
        if ((iVar1 != 0x6f) && (iVar1 != 0x74)) {
          if (iVar1 == 0x6d) goto LAB_00119399;
          lVar4 = value_size((value_t *)(piVar2 + 2));
        }
      }
      sVar5 = sVar5 + lVar4;
    }
  }
  else {
    sVar5 = 0;
  }
  return sVar5;
}

Assistant:

static size_t
th10_instr_size(
    unsigned int version,
    const thecl_instr_t* instr,
    bool is_timeline)
{
    (void)version;
    if (is_timeline) return 0;

    size_t ret = sizeof(th10_instr_t);
    thecl_param_t* param;

    list_for_each(&instr->params, param) {
        /* XXX: I think 'z' is what will be passed ... */
        if (param->type == 'm' || param->type == 'x') {
            size_t zlen = g_ecl_encode_cp932 ? utf8_to_cp932_len(param->value.val.z) : strlen(param->value.val.z);
            ret += sizeof(uint32_t) + zlen + (4 - (zlen % 4));
        } else if (param->type == 'o' || param->type == 't') {
            ret += sizeof(uint32_t);
        } else {
            ret += value_size(&param->value);
        }
    }

    return ret;
}